

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

void lddmc_serialize_tofile(FILE *out)

{
  uint8_t *puVar1;
  avl_node_t *paVar2;
  avl_iter_t *iter;
  lddmc_ser *plVar3;
  size_t sVar4;
  long lVar5;
  size_t __size;
  size_t sVar6;
  size_t sVar7;
  mddnode node;
  size_t count;
  int6 local_48;
  undefined2 uStack_42;
  undefined2 uStack_40;
  uint6 uStack_3e;
  size_t local_38;
  
  local_38 = avl_count(lddmc_ser_reversed_set);
  if (local_38 < lddmc_ser_done) {
    __assert_fail("count >= lddmc_ser_done",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                  ,0x9f2,"void lddmc_serialize_tofile(FILE *)");
  }
  if (local_38 != lddmc_ser_counter - 2) {
    __assert_fail("count == lddmc_ser_counter-2",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                  ,0x9f3,"void lddmc_serialize_tofile(FILE *)");
  }
  local_38 = local_38 - lddmc_ser_done;
  fwrite(&local_38,8,1,(FILE *)out);
  paVar2 = lddmc_ser_reversed_set;
  if (lddmc_ser_reversed_set == (avl_node_t *)0x0) {
    __size = 0x10;
  }
  else {
    __size = (ulong)(lddmc_ser_reversed_set->height + 1) * 8 + 8;
  }
  iter = (avl_iter_t *)malloc(__size);
  iter->height = 0;
  iter[1].height = (size_t)paVar2;
  sVar4 = lddmc_ser_done;
  sVar6 = 0;
  sVar7 = sVar6;
  if (lddmc_ser_done != 0) {
    do {
      plVar3 = lddmc_ser_reversed_iter_next(iter);
      sVar7 = sVar6;
      if (plVar3 == (lddmc_ser *)0x0) break;
      if (sVar6 + 2 != plVar3->assigned) {
        __assert_fail("s->assigned == index+2",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x9fd,"void lddmc_serialize_tofile(FILE *)");
      }
      sVar6 = sVar6 + 1;
      sVar7 = sVar4;
    } while (sVar4 != sVar6);
  }
  while( true ) {
    plVar3 = lddmc_ser_reversed_iter_next(iter);
    if (plVar3 == (lddmc_ser *)0x0) {
      lddmc_ser_done = lddmc_ser_counter - 2;
      free(iter);
      return;
    }
    if (sVar7 + 2 != plVar3->assigned) break;
    puVar1 = nodes->data;
    lVar5 = plVar3->mdd * 0x10;
    sVar4 = lddmc_serialize_get(*(ulong *)(puVar1 + lVar5) >> 1 & 0x7fffffffffff);
    sVar6 = lddmc_serialize_get(*(ulong *)(puVar1 + lVar5 + 8) >> 0x11);
    if ((puVar1[lVar5 + 10] & 1) == 0) {
      local_48 = (int6)sVar4 * 2;
      uStack_3e = (uint6)((sVar6 << 0x11) >> 0x10);
      uStack_42 = (undefined2)*(undefined4 *)(puVar1 + lVar5 + 6);
      uStack_40 = (undefined2)((uint)*(undefined4 *)(puVar1 + lVar5 + 6) >> 0x10);
    }
    else {
      local_48 = (int6)(sVar4 * 2);
      uStack_42 = (undefined2)(sVar4 * 2 >> 0x30);
      uStack_3e = (uint6)((sVar6 << 0x11) >> 0x10) | 1;
      uStack_40 = 0;
    }
    sVar7 = sVar7 + 1;
    if (sVar7 < sVar4) {
      __assert_fail("right <= index",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0xa0d,"void lddmc_serialize_tofile(FILE *)");
    }
    if (sVar7 < sVar6) {
      __assert_fail("down <= index",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0xa0e,"void lddmc_serialize_tofile(FILE *)");
    }
    fwrite(&local_48,0x10,1,(FILE *)out);
  }
  __assert_fail("s->assigned == index+2",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                ,0xa02,"void lddmc_serialize_tofile(FILE *)");
}

Assistant:

void
lddmc_serialize_tofile(FILE *out)
{
    size_t count = avl_count(lddmc_ser_reversed_set);
    assert(count >= lddmc_ser_done);
    assert(count == lddmc_ser_counter-2);
    count -= lddmc_ser_done;
    fwrite(&count, sizeof(size_t), 1, out);

    struct lddmc_ser *s;
    avl_iter_t *it = lddmc_ser_reversed_iter(lddmc_ser_reversed_set);

    /* Skip already written entries */
    size_t index = 0;
    while (index < lddmc_ser_done && (s=lddmc_ser_reversed_iter_next(it))) {
        assert(s->assigned == index+2);
        index++;
    }

    while ((s=lddmc_ser_reversed_iter_next(it))) {
        assert(s->assigned == index+2);
        index++;

        mddnode_t n = LDD_GETNODE(s->mdd);

        struct mddnode node;
        uint64_t right = lddmc_serialize_get(mddnode_getright(n));
        uint64_t down = lddmc_serialize_get(mddnode_getdown(n));
        if (mddnode_getcopy(n)) mddnode_makecopy(&node, right, down);
        else mddnode_make(&node, mddnode_getvalue(n), right, down);

        assert(right <= index);
        assert(down <= index);

        fwrite(&node, sizeof(struct mddnode), 1, out);
    }

    lddmc_ser_done = lddmc_ser_counter-2;
    lddmc_ser_reversed_iter_free(it);
}